

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

AActor * AActor::StaticSpawn(PClassActor *type,DVector3 *pos,replace_t allowreplacement,
                            bool SpawningMapThing)

{
  byte *pbVar1;
  PType *pPVar2;
  double dVar3;
  FState *pFVar4;
  sector_t_conflict *this;
  sector_t *psVar5;
  undefined1 auVar6 [16];
  double dVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  AActor *this_00;
  undefined4 extraout_var;
  FStrifeDialogueNode *pFVar12;
  undefined4 extraout_var_00;
  FRandom *this_01;
  SDWORD SVar13;
  double dVar14;
  FName local_34;
  PClass *pPVar11;
  
  if (type == (PClassActor *)0x0) {
    I_Error("Tried to spawn a class-less actor\n");
  }
  if (allowreplacement != NO_REPLACE) {
    type = PClassActor::GetReplacement(type,true);
  }
  this_00 = (AActor *)PClass::CreateNew(&type->super_PClass);
  pPVar11 = (this_00->super_DThinker).super_DObject.Class;
  if (pPVar11 == (PClass *)0x0) {
    iVar8 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
    pPVar11 = (PClass *)CONCAT44(extraout_var,iVar8);
    (this_00->super_DThinker).super_DObject.Class = pPVar11;
  }
  local_34.Index = (pPVar11->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index;
  iVar8 = GetConversation(&local_34);
  this_00->ConversationRoot = iVar8;
  if (iVar8 == -1) {
    pFVar12 = (FStrifeDialogueNode *)0x0;
  }
  else {
    pFVar12 = StrifeDialogues.Array[iVar8];
  }
  this_00->Conversation = pFVar12;
  (this_00->__Pos).Z = pos->Z;
  dVar3 = pos->Y;
  (this_00->__Pos).X = pos->X;
  (this_00->__Pos).Y = dVar3;
  (this_00->OldRenderPos).Z = 3.4028234663852886e+38;
  (this_00->OldRenderPos).X = 3.4028234663852886e+38;
  (this_00->OldRenderPos).Y = 3.4028234663852886e+38;
  (this_00->picnum).texnum = -1;
  iVar8 = SpawnHealth(this_00);
  this_00->health = iVar8;
  if ((this_00->Gravity == 0.0) && (!NAN(this_00->Gravity))) {
    pbVar1 = (byte *)((long)&(this_00->flags).Value + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  this_01 = &pr_spawnmobj;
  if (bglobal.m_Thinking != false) {
    this_01 = &pr_botspawnmobj;
  }
  uVar9 = (this_00->flags5).Value;
  if ((((short)uVar9 < 0) ||
      (((uVar9 >> 0x10 & 1) == 0 && (iVar8 = G_SkillProperty(SKILLP_FastMonsters), iVar8 != 0)))) &&
     (((this_00->flags3).Value & 0x2000) != 0)) {
    this_00->reactiontime = 0;
  }
  if (((this_00->flags3).Value & 0x2000) != 0) {
    uVar9 = FRandom::GenRand32(this_01);
    this_00->LastLookPlayerNumber = (byte)uVar9 & 7;
    this_00->TIDtoHate = 0;
  }
  pFVar4 = this_00->SpawnState;
  this_00->state = pFVar4;
  SVar13 = (SDWORD)pFVar4->Tics;
  if (pFVar4->TicRange != 0) {
    uVar9 = FRandom::GenRand32(&FState::pr_statetics);
    SVar13 = SVar13 + uVar9 % (pFVar4->TicRange + 1);
  }
  this_00->tics = SVar13;
  this_00->sprite = pFVar4->sprite;
  this_00->frame = pFVar4->Frame;
  (this_00->renderflags).Value =
       ((this_00->renderflags).Value & 0xffffffef) + (pFVar4->StateFlags & 4) * 4;
  iVar8 = 0;
  this_00->touching_sectorlist = (msecnode_t *)0x0;
  this_00->touching_rendersectors = (msecnode_t *)0x0;
  iVar10 = G_SkillProperty(SKILLP_FastMonsters);
  if (iVar10 != 0) {
    pPVar11 = (this_00->super_DThinker).super_DObject.Class;
    if (pPVar11 == (PClass *)0x0) {
      iVar10 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
      pPVar11 = (PClass *)CONCAT44(extraout_var_00,iVar10);
      (this_00->super_DThinker).super_DObject.Class = pPVar11;
    }
    pPVar2 = pPVar11[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.PredType;
    if (0.0 <= (double)pPVar2) {
      this_00->Speed = (double)pPVar2;
    }
  }
  LinkToWorld(this_00,(FLinkContext *)0x0,SpawningMapThing,(sector_t *)0x0);
  (this_00->Prev).Z = (this_00->__Pos).Z;
  dVar3 = (this_00->__Pos).Y;
  (this_00->Prev).X = (this_00->__Pos).X;
  (this_00->Prev).Y = dVar3;
  (this_00->PrevAngles).Roll.Degrees = (this_00->Angles).Roll.Degrees;
  dVar3 = (this_00->Angles).Yaw.Degrees;
  (this_00->PrevAngles).Pitch.Degrees = (this_00->Angles).Pitch.Degrees;
  (this_00->PrevAngles).Yaw.Degrees = dVar3;
  this = (sector_t_conflict *)this_00->Sector;
  if (this != (sector_t_conflict *)0x0) {
    iVar8 = this->PortalGroup;
  }
  this_00->PrevPortalGroup = iVar8;
  dVar14 = (this->floorplane).negiC *
           ((this->floorplane).normal.Y * pos->Y +
           (this->floorplane).normal.X * pos->X + (this->floorplane).D);
  dVar7 = (this->ceilingplane).negiC *
          (pos->Y * (this->ceilingplane).normal.Y +
          (this->ceilingplane).normal.X * pos->X + (this->ceilingplane).D);
  this_00->dropoffz = dVar14;
  auVar6._8_4_ = SUB84(dVar7,0);
  auVar6._0_8_ = dVar14;
  auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
  this_00->floorz = dVar14;
  this_00->ceilingz = (double)auVar6._8_8_;
  dVar3 = pos->Z;
  if (((dVar3 == -2147483648.0) && (!NAN(dVar3))) || ((dVar3 == 2147483646.0 && (!NAN(dVar3))))) {
LAB_0042445e:
    (this_00->__Pos).Z = dVar14;
  }
  else if ((dVar3 == 2147483647.0) && (!NAN(dVar3))) {
    dVar14 = dVar7 - this_00->Height;
    goto LAB_0042445e;
  }
  if (SpawningMapThing) {
    this_00->floorsector = (sector_t *)this;
    (this_00->floorpic).texnum = this->planes[0].Texture.texnum;
    iVar8 = sector_t::GetTerrain(this,0);
    this_00->floorterrain = iVar8;
    this_00->ceilingsector = this_00->Sector;
    (this_00->ceilingpic).texnum = this_00->Sector->planes[1].Texture.texnum;
  }
  else {
    if (type == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) {
LAB_004244c7:
      if (((this_00->flags5).Value & 0x200000) != 0) {
        (this_00->floorpic).texnum = this->planes[0].Texture.texnum;
        iVar8 = sector_t::GetTerrain(this,0);
        this_00->floorterrain = iVar8;
        psVar5 = this_00->Sector;
        this_00->floorsector = psVar5;
        (this_00->ceilingpic).texnum = psVar5->planes[1].Texture.texnum;
        this_00->ceilingsector = psVar5;
        goto LAB_0042451d;
      }
      iVar8 = 0;
    }
    else {
      do {
        type = (PClassActor *)(type->super_PClass).ParentClass;
        if (type == (PClassActor *)APlayerPawn::RegistrationInfo.MyClass) break;
      } while (type != (PClassActor *)0x0);
      if (type != (PClassActor *)0x0) goto LAB_004244c7;
      iVar8 = 1;
    }
    P_FindFloorCeiling(this_00,iVar8);
  }
LAB_0042451d:
  dVar3 = pos->Y;
  (this_00->SpawnPoint).X = pos->X;
  (this_00->SpawnPoint).Y = dVar3;
  dVar3 = pos->Z;
  if ((dVar3 != -2147483648.0) || (NAN(dVar3))) {
    if ((dVar3 != 2147483647.0) || (NAN(dVar3))) {
      if ((dVar3 != 2147483646.0) || (NAN(dVar3))) {
        psVar5 = this_00->Sector;
        (this_00->SpawnPoint).Z =
             (this_00->__Pos).Z -
             ((this_00->__Pos).Y * (psVar5->floorplane).normal.Y +
             (psVar5->floorplane).D + (this_00->__Pos).X * (psVar5->floorplane).normal.X) *
             (psVar5->floorplane).negiC;
        goto LAB_0042456d;
      }
      dVar3 = this_00->floorz;
      dVar14 = (this_00->ceilingz - this_00->Height) - dVar3;
      if (48.0 < dVar14) {
        uVar9 = FRandom::GenRand32(this_01);
        dVar3 = (double)(uVar9 & 0xff) * (dVar14 + -40.0) * 0.00390625 + this_00->floorz + 40.0;
      }
    }
    else {
      dVar3 = this_00->ceilingz - this_00->Height;
    }
  }
  else {
    dVar3 = this_00->floorz;
  }
  (this_00->__Pos).Z = dVar3;
LAB_0042456d:
  if (this_00->FloatBobPhase == 0xff) {
    uVar9 = FRandom::GenRand32(this_01);
    this_00->FloatBobPhase = (BYTE)uVar9;
  }
  if (((this_00->flags2).Value & 0x20) == 0) {
    this_00->Floorclip = 0.0;
  }
  else {
    AdjustFloorClip(this_00);
  }
  (*(this_00->super_DThinker).super_DObject._vptr_DObject[0x19])(this_00,0);
  if ((!SpawningMapThing) &&
     (CallBeginPlay(this_00), ((this_00->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    return (AActor *)0x0;
  }
  if (((level.flags._3_1_ & 0x20) != 0) && (this_00->player == (player_t *)0x0)) {
    pbVar1 = (byte *)((long)&(this_00->flags).Value + 3);
    *pbVar1 = *pbVar1 & 0xf7;
  }
  uVar9 = (this_00->flags).Value;
  if ((uVar9 & 0x8400000) == 0x400000) {
    level.total_monsters = level.total_monsters + 1;
  }
  if ((uVar9 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + 1;
  }
  if (((this_00->flags5).Value & 0x10) != 0) {
    level.total_secrets = level.total_secrets + 1;
  }
  return this_00;
}

Assistant:

AActor *AActor::StaticSpawn (PClassActor *type, const DVector3 &pos, replace_t allowreplacement, bool SpawningMapThing)
{
	if (type == NULL)
	{
		I_Error ("Tried to spawn a class-less actor\n");
	}

	if (allowreplacement)
	{
		type = type->GetReplacement();
	}

	AActor *actor;
	
	actor = static_cast<AActor *>(const_cast<PClassActor *>(type)->CreateNew ());

	// Set default dialogue
	actor->ConversationRoot = GetConversation(actor->GetClass()->TypeName);
	if (actor->ConversationRoot != -1)
	{
		actor->Conversation = StrifeDialogues[actor->ConversationRoot];
	}
	else
	{
		actor->Conversation = NULL;
	}

	actor->SetXYZ(pos);
	actor->OldRenderPos = { FLT_MAX, FLT_MAX, FLT_MAX };
	actor->picnum.SetInvalid();
	actor->health = actor->SpawnHealth();

	// Actors with zero gravity need the NOGRAVITY flag set.
	if (actor->Gravity == 0) actor->flags |= MF_NOGRAVITY;

	FRandom &rng = bglobal.m_Thinking ? pr_botspawnmobj : pr_spawnmobj;

	if (actor->isFast() && actor->flags3 & MF3_ISMONSTER)
		actor->reactiontime = 0;

	if (actor->flags3 & MF3_ISMONSTER)
	{
		actor->LastLookPlayerNumber = rng() % MAXPLAYERS;
		actor->TIDtoHate = 0;
	}

	// Set the state, but do not use SetState, because action
	// routines can't be called yet.  If the spawnstate has an action
	// routine, it will not be called.
	FState *st = actor->SpawnState;
	actor->state = st;
	actor->tics = st->GetTics();
	
	actor->sprite = st->sprite;
	actor->frame = st->GetFrame();
	actor->renderflags = (actor->renderflags & ~RF_FULLBRIGHT) | ActorRenderFlags::FromInt (st->GetFullbright());
	actor->touching_sectorlist = nullptr;	// NULL head of sector list // phares 3/13/98
	actor->touching_rendersectors = nullptr;
	if (G_SkillProperty(SKILLP_FastMonsters) && actor->GetClass()->FastSpeed >= 0)
	actor->Speed = actor->GetClass()->FastSpeed;

	// set subsector and/or block links
	actor->LinkToWorld (nullptr, SpawningMapThing);
	actor->ClearInterpolation();

	actor->dropoffz = actor->floorz = actor->Sector->floorplane.ZatPoint(pos);
	actor->ceilingz = actor->Sector->ceilingplane.ZatPoint(pos);

	// The z-coordinate needs to be set once before calling P_FindFloorCeiling
	// For FLOATRANDZ just use the floor here.
	if (pos.Z == ONFLOORZ || pos.Z == FLOATRANDZ)
	{
		actor->SetZ(actor->floorz);
	}
	else if (pos.Z == ONCEILINGZ)
	{
		actor->SetZ(actor->ceilingz - actor->Height);
	}

	if (SpawningMapThing || !type->IsDescendantOf (RUNTIME_CLASS(APlayerPawn)))
	{
		// Check if there's something solid to stand on between the current position and the
		// current sector's floor. For map spawns this must be delayed until after setting the
		// z-coordinate.
		if (!SpawningMapThing) 
		{
			P_FindFloorCeiling(actor, FFCF_ONLYSPAWNPOS);
		}
		else
		{
			actor->floorsector = actor->Sector;
			actor->floorpic = actor->floorsector->GetTexture(sector_t::floor);
			actor->floorterrain = actor->floorsector->GetTerrain(sector_t::floor);
			actor->ceilingsector = actor->Sector;
			actor->ceilingpic = actor->ceilingsector->GetTexture(sector_t::ceiling);
		}
	}
	else if (!(actor->flags5 & MF5_NOINTERACTION))
	{
		P_FindFloorCeiling (actor);
	}
	else
	{
		actor->floorpic = actor->Sector->GetTexture(sector_t::floor);
		actor->floorterrain = actor->Sector->GetTerrain(sector_t::floor);
		actor->floorsector = actor->Sector;
		actor->ceilingpic = actor->Sector->GetTexture(sector_t::ceiling);
		actor->ceilingsector = actor->Sector;
	}

	actor->SpawnPoint.X = pos.X;
	actor->SpawnPoint.Y = pos.Y;
	// do not copy Z!

	if (pos.Z == ONFLOORZ)
	{
		actor->SetZ(actor->floorz);
	}
	else if (pos.Z == ONCEILINGZ)
	{
		actor->SetZ(actor->ceilingz - actor->Height);
	}
	else if (pos.Z == FLOATRANDZ)
	{
		double space = actor->ceilingz - actor->Height - actor->floorz;
		if (space > 48)
		{
			space -= 40;
			actor->SetZ( space * rng() / 256. + actor->floorz + 40);
		}
		else
		{
			actor->SetZ(actor->floorz);
		}
	}
	else
	{
		actor->SpawnPoint.Z = (actor->Z() - actor->Sector->floorplane.ZatPoint(actor));
	}

	if (actor->FloatBobPhase == (BYTE)-1) actor->FloatBobPhase = rng();	// Don't make everything bob in sync (unless deliberately told to do)
	if (actor->flags2 & MF2_FLOORCLIP)
	{
		actor->AdjustFloorClip ();
	}
	else
	{
		actor->Floorclip = 0;
	}
	actor->UpdateWaterLevel (false);
	if (!SpawningMapThing)
	{
		actor->CallBeginPlay ();
		if (actor->ObjectFlags & OF_EuthanizeMe)
		{
			return NULL;
		}
	}
	if (level.flags & LEVEL_NOALLIES && !actor->player)
	{
		actor->flags &= ~MF_FRIENDLY;
	}
	// [RH] Count monsters whenever they are spawned.
	if (actor->CountsAsKill())
	{
		level.total_monsters++;
	}
	// [RH] Same, for items
	if (actor->flags & MF_COUNTITEM)
	{
		level.total_items++;
	}
	// And for secrets
	if (actor->flags5 & MF5_COUNTSECRET)
	{
		level.total_secrets++;
	}
	return actor;
}